

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triadic.h
# Opt level: O1

TriangleInfo * betterWedgeEnumerator(TriangleInfo *__return_storage_ptr__,CGraph *gout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Count CVar6;
  
  __return_storage_ptr__->total = 0;
  if (gout->nVertices < 1) {
    CVar6 = 0;
  }
  else {
    CVar6 = 0;
    lVar5 = 0;
    do {
      lVar2 = gout->offsets[lVar5];
      lVar4 = lVar5 + 1;
      if (lVar2 < gout->offsets[lVar5 + 1]) {
        do {
          lVar3 = lVar2 + 1;
          lVar5 = lVar3;
          if (lVar3 < gout->offsets[lVar4]) {
            do {
              lVar1 = Escape::CGraph::getEdgeCount(gout,gout->nbors[lVar2],gout->nbors[lVar5]);
              if (lVar1 == -1) {
                lVar1 = 0;
              }
              CVar6 = CVar6 + lVar1;
              lVar5 = lVar5 + 1;
            } while (lVar5 < gout->offsets[lVar4]);
          }
          lVar2 = lVar3;
        } while (lVar3 < gout->offsets[lVar4]);
      }
      lVar5 = lVar4;
    } while (lVar4 < gout->nVertices);
  }
  __return_storage_ptr__->total = CVar6;
  return __return_storage_ptr__;
}

Assistant:

TriangleInfo betterWedgeEnumerator(CGraph *gout) {
    TriangleInfo ret;   // output
    ret.total = 0;      // initialize outout

    // We do not need per vertex and per edge information. So commenting out those parts.
    // If you need such information, uncomment them.

//    ret.perVertex = new EdgeIdx[gout->nVertices + 1];
//    ret.perEdge = new EdgeIdx[gout->nEdges + 1];
//
//    for (VertexIdx i = 0; i < gout->nVertices; ++i)
//        ret.perVertex[i] = 0;
//
//    for (EdgeIdx j = 0; j < gout->nEdges; ++j)
//        ret.perEdge[j] = 0;

    VertexIdx end1, end2;
    EdgeIdx loc;

    for (VertexIdx i = 0; i < gout->nVertices; ++i) // loop over vertices
        for (EdgeIdx j = gout->offsets[i]; j < gout->offsets[i + 1]; ++j)   // loop over neighbor of i
            for (EdgeIdx k = j + 1; k < gout->offsets[i + 1]; ++k)         // loop over another neighbor of i
            {
                end1 = gout->nbors[j];     // we are now looking at wedge (i, end1, end2), centered at i
                end2 = gout->nbors[k];

                // note that end1 < end2 because of the labeled ordering

                //loc = gout->getEdgeBinary(end1, end2);
                loc = gout->getEdgeCount(end1, end2);
                if (loc != -1)        // (end1, end2) is present
                {
                    //ret.total++;       // found a triangle! So update total.
                    ret.total += loc;
//                    ret.perVertex[i]++; // update all per vertex counts
//                    ret.perVertex[end1]++;
//                    ret.perVertex[end2]++;
//
//                    ret.perEdge[j]++;  // update all per edge counts. Note that location used is same as position in g->nbors
//                    ret.perEdge[k]++;
//                    ret.perEdge[loc]++;
                }
            }

    return ret;
}